

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O1

void brotli::CompareAndPushToQueue<brotli::Histogram<704>>
               (Histogram<704> *out,uint32_t *cluster_size,uint32_t idx1,uint32_t idx2,
               vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *pairs)

{
  pointer *ppHVar1;
  double dVar2;
  uint uVar3;
  size_t sVar4;
  pointer pHVar5;
  HistogramPair *__args;
  iterator __position;
  double dVar6;
  uint32_t uVar7;
  uint uVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double __x;
  HistogramPair p;
  Histogram<704> combo;
  HistogramPair local_b80;
  double local_b68;
  double local_b60;
  double local_b58;
  double local_b50;
  double local_b48;
  Histogram<704> local_b40;
  
  if (idx1 != idx2) {
    uVar8 = idx1;
    if (idx1 < idx2) {
      uVar8 = idx2;
    }
    uVar12 = (ulong)idx1;
    if (idx2 < idx1) {
      uVar12 = (ulong)idx2;
    }
    local_b80.idx1 = (uint32_t)uVar12;
    uVar11 = (ulong)cluster_size[uVar12];
    uVar3 = cluster_size[uVar8];
    uVar10 = (ulong)uVar3;
    local_b68 = (double)uVar11;
    local_b80.idx2 = uVar8;
    if (uVar11 < 0x100) {
      local_b60 = (double)*(float *)(kLog2Table + uVar11 * 4);
    }
    else {
      local_b60 = log2(local_b68);
    }
    uVar11 = uVar11 + uVar10;
    local_b48 = (double)uVar10;
    if (uVar3 < 0x100) {
      dVar17 = (double)*(float *)(kLog2Table + uVar10 * 4);
    }
    else {
      dVar17 = log2(local_b48);
    }
    __x = (double)uVar11;
    if (uVar11 < 0x100) {
      dVar6 = (double)*(float *)(kLog2Table + uVar11 * 4);
    }
    else {
      local_b58 = __x;
      local_b50 = dVar17;
      dVar6 = log2(__x);
      dVar17 = local_b50;
      __x = local_b58;
    }
    dVar2 = out[uVar12].bit_cost_;
    uVar15 = SUB84(dVar2,0);
    uVar16 = (undefined4)((ulong)dVar2 >> 0x20);
    local_b80.cost_combo = out[uVar8].bit_cost_;
    local_b80.cost_diff =
         (((local_b68 * local_b60 + dVar17 * local_b48) - __x * dVar6) * 0.5 - dVar2) -
         local_b80.cost_combo;
    if (out[uVar12].total_count_ != 0) {
      sVar4 = out[uVar8].total_count_;
      if (sVar4 != 0) {
        pHVar5 = (pairs->
                 super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (pHVar5 == (pairs->
                      super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          local_b68 = 1e+99;
        }
        else {
          local_b68 = pHVar5->cost_diff;
          if (local_b68 <= 0.0) {
            local_b68 = 0.0;
          }
        }
        memcpy(&local_b40,out + uVar12,0xb10);
        local_b40.total_count_ = local_b40.total_count_ + sVar4;
        lVar9 = 0;
        do {
          local_b40.data_[lVar9] = local_b40.data_[lVar9] + out[uVar8].data_[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x2c0);
        dVar17 = PopulationCost<704>(&local_b40);
        uVar15 = SUB84(dVar17,0);
        uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
        if (local_b68 - local_b80.cost_diff <= dVar17) {
          return;
        }
      }
      local_b80.cost_combo = (double)CONCAT44(uVar16,uVar15);
    }
    local_b80.cost_diff = local_b80.cost_combo + local_b80.cost_diff;
    __args = (pairs->
             super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (pairs->super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__args != __position._M_current) {
      dVar17 = __args->cost_diff;
      bVar14 = dVar17 == local_b80.cost_diff;
      bVar13 = dVar17 < local_b80.cost_diff;
      if ((bVar14) && (!NAN(dVar17) && !NAN(local_b80.cost_diff))) {
        uVar8 = __args->idx2 - __args->idx1;
        bVar13 = uVar8 < local_b80.idx2 - local_b80.idx1;
        bVar14 = uVar8 == local_b80.idx2 - local_b80.idx1;
      }
      if (!bVar13 && !bVar14) {
        if (__position._M_current ==
            (pairs->
            super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>>::
          _M_realloc_insert<brotli::HistogramPair_const&>
                    ((vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>> *)pairs,
                     __position,__args);
        }
        else {
          (__position._M_current)->cost_diff = __args->cost_diff;
          uVar7 = __args->idx2;
          dVar17 = __args->cost_combo;
          (__position._M_current)->idx1 = __args->idx1;
          (__position._M_current)->idx2 = uVar7;
          (__position._M_current)->cost_combo = dVar17;
          ppHVar1 = &(pairs->
                     super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppHVar1 = *ppHVar1 + 1;
        }
        pHVar5 = (pairs->
                 super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pHVar5->cost_diff = local_b80.cost_diff;
        pHVar5->idx1 = local_b80.idx1;
        pHVar5->idx2 = local_b80.idx2;
        pHVar5->cost_combo = local_b80.cost_combo;
        return;
      }
    }
    if (__position._M_current ==
        (pairs->super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>>::
      _M_realloc_insert<brotli::HistogramPair_const&>
                ((vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>> *)pairs,
                 __position,&local_b80);
    }
    else {
      (__position._M_current)->cost_diff = local_b80.cost_diff;
      (__position._M_current)->idx1 = local_b80.idx1;
      (__position._M_current)->idx2 = local_b80.idx2;
      (__position._M_current)->cost_combo = local_b80.cost_combo;
      ppHVar1 = &(pairs->
                 super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
  }
  return;
}

Assistant:

void CompareAndPushToQueue(const HistogramType* out,
                           const uint32_t* cluster_size,
                           uint32_t idx1, uint32_t idx2,
                           std::vector<HistogramPair>* pairs) {
  if (idx1 == idx2) {
    return;
  }
  if (idx2 < idx1) {
    uint32_t t = idx2;
    idx2 = idx1;
    idx1 = t;
  }
  bool store_pair = false;
  HistogramPair p;
  p.idx1 = idx1;
  p.idx2 = idx2;
  p.cost_diff = 0.5 * ClusterCostDiff(cluster_size[idx1], cluster_size[idx2]);
  p.cost_diff -= out[idx1].bit_cost_;
  p.cost_diff -= out[idx2].bit_cost_;

  if (out[idx1].total_count_ == 0) {
    p.cost_combo = out[idx2].bit_cost_;
    store_pair = true;
  } else if (out[idx2].total_count_ == 0) {
    p.cost_combo = out[idx1].bit_cost_;
    store_pair = true;
  } else {
    double threshold = pairs->empty() ? 1e99 :
        std::max(0.0, (*pairs)[0].cost_diff);
    HistogramType combo = out[idx1];
    combo.AddHistogram(out[idx2]);
    double cost_combo = PopulationCost(combo);
    if (cost_combo < threshold - p.cost_diff) {
      p.cost_combo = cost_combo;
      store_pair = true;
    }
  }
  if (store_pair) {
    p.cost_diff += p.cost_combo;
    if (!pairs->empty() && (pairs->front() < p)) {
      // Replace the top of the queue if needed.
      pairs->push_back(pairs->front());
      pairs->front() = p;
    } else {
      pairs->push_back(p);
    }
  }
}